

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

int __thiscall FixedSizeCache<int>::at(FixedSizeCache<int> *this,int index)

{
  runtime_error *this_00;
  const_reference pvVar1;
  int index_local;
  FixedSizeCache<int> *this_local;
  
  if (this->_count <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache index out-of-range");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::at(&this->_data,(long)index);
  return *pvVar1;
}

Assistant:

T
    at(int const index) const
    {
        if (index >= this->_count) throw std::runtime_error("FixedSizeCache index out-of-range");
        return this->_data.at(index);
    }